

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O0

Shrinkable<int> __thiscall
rc::gen::detail::OneOfGen<int>::operator()(OneOfGen<int> *this,Random *random,int size)

{
  Number NVar1;
  size_type sVar2;
  Random *random_00;
  undefined4 in_register_00000014;
  Random *this_00;
  size_t i;
  Random r;
  int size_local;
  Random *random_local;
  OneOfGen<int> *this_local;
  
  this_00 = (Random *)this;
  memcpy(&i,(void *)CONCAT44(in_register_00000014,size),0x58);
  Random::split(this_00);
  NVar1 = Random::next(random);
  sVar2 = std::vector<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>::size
                    ((vector<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_> *)random);
  random_00 = (Random *)
              std::vector<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_>::operator[]
                        ((vector<rc::Gen<int>,_std::allocator<rc::Gen<int>_>_> *)random,
                         NVar1 % sVar2);
  Gen<int>::operator()((Gen<int> *)this_00,random_00,(int)&i);
  return (Shrinkable<int>)(IShrinkableImpl *)this;
}

Assistant:

Shrinkable<T> operator()(const Random &random, int size) const {
    Random r(random);
    const auto i = static_cast<std::size_t>(r.split().next() % m_gens.size());
    return m_gens[i](r, size);
  }